

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memutil.cc
# Opt level: O2

size_t absl::strings_internal::memcspn(char *s,size_t slen,char *reject)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *p;
  char *pcVar5;
  bool bVar6;
  
  pcVar2 = s;
  sVar4 = slen;
  do {
    pcVar3 = pcVar2;
    bVar6 = sVar4 == 0;
    sVar4 = sVar4 - 1;
    if (bVar6) {
      return slen;
    }
    pcVar5 = reject;
    while (cVar1 = *pcVar5, pcVar2 = pcVar3 + 1, cVar1 != '\0') {
      pcVar5 = pcVar5 + 1;
      if (cVar1 == *pcVar3) {
        return (long)pcVar3 - (long)s;
      }
    }
  } while( true );
}

Assistant:

size_t memcspn(const char* s, size_t slen, const char* reject) {
  const char* p = s;
  const char* spanp;
  char c, sc;

  while (slen-- != 0) {
    c = *p++;
    for (spanp = reject; (sc = *spanp++) != '\0';)
      if (sc == c) return p - 1 - s;
  }
  return p - s;
}